

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t prepare_raw_data_slot(psa_key_type_t type,size_t bits,raw_data *raw)

{
  psa_status_t pVar1;
  uint8_t *puVar2;
  int iVar3;
  undefined6 in_register_0000003a;
  
  iVar3 = (int)CONCAT62(in_register_0000003a,type);
  if (((iVar3 != 0x1001) && (iVar3 != 0x1100)) && (iVar3 != 0x1200)) {
    if (iVar3 == 0x2002) {
      if (0x7f8 < bits - 8 || (bits & 7) != 0) {
        return -0x87;
      }
      goto LAB_001109cb;
    }
    if (iVar3 == 0x2004) {
      if (bits != 0x100) {
        return -0x87;
      }
      goto LAB_001109cb;
    }
    if (iVar3 == 0x2301) {
      if (((bits != 0x40) && (bits != 0x80)) && (bits != 0xc0)) {
        return -0x87;
      }
    }
    else {
      if ((iVar3 != 0x2403) && (iVar3 != 0x2400)) {
        return -0x86;
      }
      if (((bits != 0x80) && (bits != 0xc0)) && (bits != 0x100)) {
        return -0x87;
      }
    }
  }
  if ((bits & 7) != 0) {
    return -0x87;
  }
LAB_001109cb:
  raw->bytes = bits >> 3;
  puVar2 = (uint8_t *)calloc(1,bits >> 3);
  raw->data = puVar2;
  pVar1 = 0;
  if (puVar2 == (uint8_t *)0x0) {
    raw->bytes = 0;
    pVar1 = -0x8d;
  }
  return pVar1;
}

Assistant:

static psa_status_t prepare_raw_data_slot( psa_key_type_t type,
                                           size_t bits,
                                           struct raw_data *raw )
{
    /* Check that the bit size is acceptable for the key type */
    switch( type )
    {
        case PSA_KEY_TYPE_RAW_DATA:
#if defined(MBEDTLS_MD_C)
        case PSA_KEY_TYPE_HMAC:
#endif
        case PSA_KEY_TYPE_DERIVE:
            break;
#if defined(MBEDTLS_AES_C)
        case PSA_KEY_TYPE_AES:
            if( bits != 128 && bits != 192 && bits != 256 )
                return( PSA_ERROR_INVALID_ARGUMENT );
            break;
#endif
#if defined(MBEDTLS_CAMELLIA_C)
        case PSA_KEY_TYPE_CAMELLIA:
            if( bits != 128 && bits != 192 && bits != 256 )
                return( PSA_ERROR_INVALID_ARGUMENT );
            break;
#endif
#if defined(MBEDTLS_DES_C)
        case PSA_KEY_TYPE_DES:
            if( bits != 64 && bits != 128 && bits != 192 )
                return( PSA_ERROR_INVALID_ARGUMENT );
            break;
#endif
#if defined(MBEDTLS_ARC4_C)
        case PSA_KEY_TYPE_ARC4:
            if( bits < 8 || bits > 2048 )
                return( PSA_ERROR_INVALID_ARGUMENT );
            break;
#endif
#if defined(MBEDTLS_CHACHA20_C)
        case PSA_KEY_TYPE_CHACHA20:
            if( bits != 256 )
                return( PSA_ERROR_INVALID_ARGUMENT );
            break;
#endif
        default:
            return( PSA_ERROR_NOT_SUPPORTED );
    }
    if( bits % 8 != 0 )
        return( PSA_ERROR_INVALID_ARGUMENT );

    /* Allocate memory for the key */
    raw->bytes = PSA_BITS_TO_BYTES( bits );
    raw->data = mbedtls_calloc( 1, raw->bytes );
    if( raw->data == NULL )
    {
        raw->bytes = 0;
        return( PSA_ERROR_INSUFFICIENT_MEMORY );
    }
    return( PSA_SUCCESS );
}